

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall
cmCTestRunTest::WriteLogOutputTop(cmCTestRunTest *this,size_t completed,size_t total)

{
  cmCTest *pcVar1;
  int iVar2;
  _Setw _Var3;
  ostream *poVar4;
  reference pbVar5;
  char *pcVar6;
  bool bVar7;
  string local_6f8 [32];
  undefined1 local_6d8 [8];
  ostringstream cmCTestLog_msg_1;
  string local_560 [32];
  string local_540 [32];
  undefined1 local_520 [8];
  ostringstream cmCTestLog_msg;
  string *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string outname;
  string local_360 [4];
  int maxTestNameWidth;
  int local_33c;
  undefined1 local_338 [8];
  ostringstream indexStr;
  undefined1 local_198 [7];
  bool progressOnLast;
  ostringstream outputStream;
  size_t total_local;
  size_t completed_local;
  cmCTestRunTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  bVar7 = false;
  if (this->RepeatMode != UntilPass) {
    bVar7 = this->RepeatMode != AfterTimeout;
  }
  if (((!bVar7) || (this->NumberOfRunsLeft != 1)) &&
     ((bVar7 || (this->NumberOfRunsLeft != this->NumberOfRunsTotal)))) {
    bVar7 = cmCTest::GetTestProgressOutput(this->CTest);
    if (!bVar7) {
      iVar2 = getNumWidth(total);
      _Var3 = std::setw(iVar2);
      poVar4 = std::operator<<((ostream *)local_198,_Var3);
      std::operator<<(poVar4,"  ");
      iVar2 = getNumWidth(total);
      _Var3 = std::setw(iVar2);
      poVar4 = std::operator<<((ostream *)local_198,_Var3);
      std::operator<<(poVar4,"  ");
      goto LAB_00260cb9;
    }
  }
  iVar2 = getNumWidth(total);
  _Var3 = std::setw(iVar2);
  poVar4 = std::operator<<((ostream *)local_198,_Var3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,completed);
  std::operator<<(poVar4,"/");
  iVar2 = getNumWidth(total);
  _Var3 = std::setw(iVar2);
  poVar4 = std::operator<<((ostream *)local_198,_Var3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,total);
  std::operator<<(poVar4," ");
LAB_00260cb9:
  if ((this->TestHandler->MemCheck & 1U) == 0) {
    std::operator<<((ostream *)local_198,"Test");
  }
  else {
    std::operator<<((ostream *)local_198,"MemCheck");
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_338);
  poVar4 = std::operator<<((ostream *)local_338," #");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->Index);
  std::operator<<(poVar4,":");
  iVar2 = cmCTestTestHandler::GetMaxIndex(this->TestHandler);
  iVar2 = getNumWidth((long)iVar2);
  local_33c = (int)std::setw(iVar2 + 3);
  poVar4 = std::operator<<((ostream *)local_198,(_Setw)local_33c);
  std::__cxx11::ostringstream::str();
  std::operator<<(poVar4,local_360);
  std::__cxx11::string::~string(local_360);
  std::operator<<((ostream *)local_198," ");
  outname.field_2._12_4_ = cmCTest::GetMaxTestNameWidth(this->CTest);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 &this->TestProperties->Name," ");
  std::__cxx11::string::resize((ulong)&__range1,(char)outname.field_2._12_4_ + '\x04');
  std::operator<<((ostream *)local_198,(string *)&__range1);
  poVar4 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  poVar4 = std::operator<<(poVar4,"/");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->TestHandler->TotalNumberOfTests);
  poVar4 = std::operator<<(poVar4," Testing: ");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  poVar4 = std::operator<<(poVar4,"/");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->TestHandler->TotalNumberOfTests);
  poVar4 = std::operator<<(poVar4," Test: ");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(this->TestHandler->LogFile,"Command: \"");
  poVar4 = std::operator<<(poVar4,(string *)&this->ActualCommand);
  std::operator<<(poVar4,"\"");
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->Arguments);
  arg = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->Arguments);
  while( true ) {
    bVar7 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar7) break;
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    poVar4 = std::operator<<(this->TestHandler->LogFile," \"");
    poVar4 = std::operator<<(poVar4,(string *)pbVar5);
    std::operator<<(poVar4,"\"");
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (this->TestHandler->LogFile,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"Directory: ");
  poVar4 = std::operator<<(poVar4,(string *)&this->TestProperties->Directory);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  poVar4 = std::operator<<(poVar4,"\" start time: ");
  poVar4 = std::operator<<(poVar4,(string *)&this->StartTime);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(this->TestHandler->LogFile,"Output:");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"----------------------------------------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(this->TestHandler->LogFile,(string *)&this->ProcessOutput);
  poVar4 = std::operator<<(poVar4,"<end of output>");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  bVar7 = cmCTest::GetTestProgressOutput(this->CTest);
  if (!bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_520);
    std::__cxx11::ostringstream::str();
    std::operator<<((ostream *)local_520,local_540);
    std::__cxx11::string::~string(local_540);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x3b5,pcVar6,false);
    std::__cxx11::string::~string(local_560);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_520);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d8);
  poVar4 = std::operator<<((ostream *)local_6d8,"Testing ");
  poVar4 = std::operator<<(poVar4,(string *)this->TestProperties);
  std::operator<<(poVar4," ... ");
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x3b9,pcVar6,false);
  std::__cxx11::string::~string(local_6f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d8);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_338);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return;
}

Assistant:

void cmCTestRunTest::WriteLogOutputTop(size_t completed, size_t total)
{
  std::ostringstream outputStream;

  // If this is the last or only run of this test, or progress output is
  // requested, then print out completed / total.
  // Only issue is if a test fails and we are running until fail
  // then it will never print out the completed / total, same would
  // got for run until pass.  Trick is when this is called we don't
  // yet know if we are passing or failing.
  bool const progressOnLast =
    (this->RepeatMode != cmCTest::Repeat::UntilPass &&
     this->RepeatMode != cmCTest::Repeat::AfterTimeout);
  if ((progressOnLast && this->NumberOfRunsLeft == 1) ||
      (!progressOnLast && this->NumberOfRunsLeft == this->NumberOfRunsTotal) ||
      this->CTest->GetTestProgressOutput()) {
    outputStream << std::setw(getNumWidth(total)) << completed << "/";
    outputStream << std::setw(getNumWidth(total)) << total << " ";
  }
  // if this is one of several runs of a test just print blank space
  // to keep things neat
  else {
    outputStream << std::setw(getNumWidth(total)) << "  ";
    outputStream << std::setw(getNumWidth(total)) << "  ";
  }

  if (this->TestHandler->MemCheck) {
    outputStream << "MemCheck";
  } else {
    outputStream << "Test";
  }

  std::ostringstream indexStr;
  indexStr << " #" << this->Index << ":";
  outputStream << std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
               << indexStr.str();
  outputStream << " ";

  const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
  std::string outname = this->TestProperties->Name + " ";
  outname.resize(maxTestNameWidth + 4, '.');
  outputStream << outname;

  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
                              << this->TestHandler->TotalNumberOfTests
                              << " Testing: " << this->TestProperties->Name
                              << std::endl;
  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
                              << this->TestHandler->TotalNumberOfTests
                              << " Test: " << this->TestProperties->Name
                              << std::endl;
  *this->TestHandler->LogFile << "Command: \"" << this->ActualCommand << "\"";

  for (std::string const& arg : this->Arguments) {
    *this->TestHandler->LogFile << " \"" << arg << "\"";
  }
  *this->TestHandler->LogFile
    << std::endl
    << "Directory: " << this->TestProperties->Directory << std::endl
    << "\"" << this->TestProperties->Name
    << "\" start time: " << this->StartTime << std::endl;

  *this->TestHandler->LogFile
    << "Output:" << std::endl
    << "----------------------------------------------------------"
    << std::endl;
  *this->TestHandler->LogFile << this->ProcessOutput << "<end of output>"
                              << std::endl;

  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, outputStream.str());
  }

  cmCTestLog(this->CTest, DEBUG,
             "Testing " << this->TestProperties->Name << " ... ");
}